

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::swap(Forth *this)

{
  uint Value;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,2,"SWAP");
  this_00 = &this->dStack;
  Value = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::moveStack(this_00,1,0,1);
  ForthStack<unsigned_int>::setTop(this_00,Value);
  return;
}

Assistant:

void swap() {
			REQUIRE_DSTACK_DEPTH(2, "SWAP");
			auto n = 1;
			if (n > 0) {
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}